

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_muladd_m68k(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  float16 fVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  int count;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  FloatParts a_00;
  FloatParts FVar19;
  FloatParts c_00;
  FloatParts b_00;
  float_status *in_stack_ffffffffffffff80;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  uint64_t c_lo;
  uint64_t c_hi;
  ulong uVar8;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  a_00 = float16a_unpack_canonical(a,status,&float16_params);
  uVar8 = a_00._8_8_;
  uVar15 = a_00.frac;
  FVar19 = float16a_unpack_canonical(b,status,&float16_params);
  uVar14 = FVar19._8_8_;
  c_00 = float16a_unpack_canonical(c,status,&float16_params);
  uVar9 = c_00._8_8_;
  uVar11 = c_00.frac;
  if (((uVar8 | uVar14 | uVar9) & 0xfc00000000) != 0) {
    uVar14 = uVar14 & 0xffffffffffff;
    b_00.exp = (int)uVar14;
    b_00.cls = (char)(uVar14 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar14 >> 0x28);
    b_00._14_2_ = (short)(uVar14 >> 0x30);
    b_00.frac = FVar19.frac;
    FVar19 = pick_nan_muladd(a_00,b_00,c_00,SUB81(status,0),in_stack_ffffffffffffff80);
    a_00.exp = (undefined4)local_68;
    a_00.cls = local_68._4_1_;
    a_00.sign = (_Bool)local_68._5_1_;
    a_00._14_2_ = local_68._6_2_;
    a_00.frac = local_58;
    goto LAB_00648ecb;
  }
  uVar7 = FVar19._12_4_ & 0xff;
  uVar5 = a_00._12_4_ & 0xff;
  if ((1 << (FVar19.cls & 0x1f) | 1 << (a_00._12_4_ & 0x1f)) != 10) {
    uVar12 = (uint)local_50 & 4;
    uVar10 = 0x10000000000;
    uVar18 = uVar9 & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar18 = uVar9;
    }
    uVar9 = (uVar14 ^ uVar8) & 0x10000000000;
    uVar14 = (ulong)(uVar9 == 0);
    if ((local_50 & 2) == 0) {
      uVar14 = uVar9 >> 0x28;
    }
    uVar3 = (uint)(uVar18 >> 0x20);
    uVar13 = (uint)uVar14;
    local_68 = uVar8;
    if ((uVar5 != 3) && (uVar7 != 3)) {
      uVar16 = uVar3 & 3;
      if (uVar16 == 3) {
        uVar5 = uVar3 >> 8 & 1;
LAB_00648e76:
        if (uVar5 == uVar12 >> 2) {
          uVar10 = 0;
        }
        uVar10 = uVar10 | uVar8 & 0xffff0000ffffffff | 0x300000000;
        goto LAB_00648ec6;
      }
      uVar17 = (uint)uVar18;
      if ((uVar5 == 1) || (uVar7 == 1)) {
        if (uVar16 == 1) {
          if ((uVar3 >> 8 & 1) != uVar13) {
            uVar14 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar18 = uVar18 & 0xffff0003ffffffff | uVar14 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar18 = uVar18 & 0xffffff0300000000 | (ulong)(uVar17 - 1);
        }
        if (((uint)(uVar18 >> 0x28) & 1) == uVar12 >> 2) {
          uVar10 = 0;
        }
        uVar10 = uVar10 | uVar18 & 0xffff00ffffffffff;
        FVar19.exp = (int)uVar10;
        FVar19.cls = (char)(uVar10 >> 0x20);
        FVar19.sign = (_Bool)(char)(uVar10 >> 0x28);
        FVar19._14_2_ = (short)(uVar10 >> 0x30);
        FVar19.frac = uVar11;
        goto LAB_00648ecb;
      }
      local_5c = uVar12;
      local_58 = uVar15;
      if ((uVar5 != 2) || (uVar7 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar5 = FVar19.exp + a_00.exp;
      mul64To128(uVar15,FVar19.frac,&local_48,&local_70);
      if ((local_48 >> 0x3d & 1) != 0) {
        local_70 = (ulong)((uint)local_70 & 1) | local_48 << 0x3f | local_70 >> 1;
        local_48 = local_48 >> 1;
        uVar5 = uVar5 + 1;
      }
      uVar8 = local_48;
      if (uVar16 == 1) {
        uVar15 = (ulong)((local_70 & 0x3fffffffffffffff) != 0) | local_48 << 2 | local_70 >> 0x3e;
      }
      else {
        count = uVar5 - uVar17;
        if ((uVar3 >> 8 & 1) == uVar13) {
          if (count < 1) {
            shift128RightJamming(local_48,local_70,0x3e - count,&local_48,&local_70);
            uVar15 = uVar11 + local_70;
          }
          else {
            c_hi = uVar11 >> 2;
            c_lo = 0;
            shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
            uVar15 = (ulong)((c_lo + local_70 & 0x3fffffffffffffff) != 0) |
                     (uVar8 + c_hi + (ulong)CARRY8(c_lo,local_70)) * 4 | c_lo + local_70 >> 0x3e;
            uVar18 = (ulong)uVar5;
          }
          uVar5 = (uint)uVar18;
          if ((long)uVar15 < 0) {
            uVar15 = (ulong)((uint)uVar15 & 1) | uVar15 >> 1;
            uVar5 = uVar5 + 1;
          }
        }
        else {
          uVar11 = uVar11 >> 2;
          c_lo = 0;
          c_hi = uVar11;
          if (count < 1) {
            shift128RightJamming(local_48,local_70,-count,&local_48,&local_70);
            uVar9 = local_48 - uVar11;
            uVar8 = local_70;
            if (local_48 < uVar11 || uVar5 != uVar17) {
              uVar9 = (uVar11 - local_48) - (ulong)(local_70 != 0);
              uVar13 = (uint)(byte)((byte)uVar14 ^ 1);
              uVar8 = -local_70;
              uVar5 = uVar17;
            }
          }
          else {
            shift128RightJamming(uVar11,0,count,&c_hi,&c_lo);
            uVar9 = (uVar8 - c_hi) - (ulong)(local_70 < c_lo);
            uVar8 = local_70 - c_lo;
          }
          a_00.exp = (undefined4)local_68;
          a_00.cls = local_68._4_1_;
          a_00.sign = (_Bool)local_68._5_1_;
          a_00._14_2_ = local_68._6_2_;
          a_00.frac = local_58;
          if (uVar9 == 0 && uVar8 == 0) {
            uVar11 = 0x10000000000;
            if (local_5c >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
              uVar11 = 0;
            }
            FVar19._8_8_ = (uVar11 | local_68 & 0xffff0000ffffffff) + 0x100000000;
            FVar19.frac = local_58;
            goto LAB_00648ecb;
          }
          if (uVar9 == 0) {
            if (uVar8 == 0) {
              uVar11 = 0x40;
            }
            else {
              uVar11 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = uVar11 ^ 0x3f;
            }
            if (uVar11 == 0) {
              uVar7 = 0x40;
              goto LAB_006491e3;
            }
            uVar7 = (int)uVar11 + 0x40;
            uVar15 = uVar8 << ((char)uVar11 - 1U & 0x3f);
          }
          else {
            lVar1 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar7 = (uint)lVar1 ^ 0x3f;
LAB_006491e3:
            bVar6 = (char)uVar7 - 1;
            bVar2 = bVar6 & 0x3f;
            uVar15 = (ulong)(uVar8 << (bVar6 & 0x3f) != 0) | uVar9 << bVar2 | uVar8 >> 0x40 - bVar2;
          }
          uVar5 = (uVar5 - uVar7) + 3;
        }
      }
      a_00.exp = (undefined4)local_68;
      a_00.cls = local_68._4_1_;
      a_00.sign = (_Bool)local_68._5_1_;
      a_00._14_2_ = local_68._6_2_;
      a_00.frac = local_58;
      uVar11 = 0x10000000000;
      if (local_5c >> 2 == uVar13) {
        uVar11 = 0;
      }
      uVar11 = uVar11 | local_68 & 0xffff000000000000 |
               (ulong)((((int)local_50 << 0x1c) >> 0x1f) + uVar5) | 0x200000000;
      FVar19.exp = (int)uVar11;
      FVar19.cls = (char)(uVar11 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar11 >> 0x28);
      FVar19._14_2_ = (short)(uVar11 >> 0x30);
      FVar19.frac = uVar15;
      goto LAB_00648ecb;
    }
    if ((~uVar18 & 0x300000000) != 0) {
      if (uVar12 >> 2 == uVar13) {
        uVar10 = 0;
      }
      uVar10 = uVar10 | uVar8 & 0xffff0000ffffffff | 0x300000000;
LAB_00648ec6:
      FVar19.exp = (int)uVar10;
      FVar19.cls = (char)(uVar10 >> 0x20);
      FVar19.sign = (_Bool)(char)(uVar10 >> 0x28);
      FVar19._14_2_ = (short)(uVar10 >> 0x30);
      FVar19.frac = uVar15;
      goto LAB_00648ecb;
    }
    uVar5 = uVar3 >> 8 & 1;
    if (uVar5 == uVar13) goto LAB_00648e76;
  }
  a_00.exp = (undefined4)local_68;
  a_00.cls = local_68._4_1_;
  a_00.sign = (_Bool)local_68._5_1_;
  a_00._14_2_ = local_68._6_2_;
  a_00.frac = uVar15;
  FVar19.exp = 0x7fffffff;
  FVar19.cls = float_class_qnan;
  FVar19.sign = false;
  FVar19._14_2_ = 0;
  FVar19.frac = 0x3fffffffffffffff;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00648ecb:
  local_68 = a_00._8_8_;
  local_58 = a_00.frac;
  fVar4 = float16a_round_pack_canonical(FVar19,status,&float16_params);
  return fVar4;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}